

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
* __thiscall
phmap::priv::btree<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>::
insert_unique<int_const&>
          (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
           *__return_storage_ptr__,
          btree<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>> *this,
          key_type *key,int *args)

{
  bool bVar1;
  node_type *pnVar2;
  btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>> *this_00;
  template_ElementType<2UL> *ptVar3;
  int iVar4;
  SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_false>
  SVar5;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  bVar6;
  iterator iVar7;
  
  if (*(long *)(this + 0x10) == 0) {
    pnVar2 = btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
             ::new_leaf_root_node
                       ((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                         *)this,1);
    *(node_type **)(this + 8) = pnVar2;
    *(node_type **)this = pnVar2;
  }
  SVar5 = btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          internal_locate_impl<int>
                    ((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                      *)this,key);
  bVar6._8_8_ = SVar5.value._8_8_;
  bVar6.node = (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                *)(ulong)(uint)SVar5.value.position;
  bVar6 = internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>,int&,int*>>
                    ((btree<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                      *)SVar5.value.node,bVar6);
  this_00 = (btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
             *)bVar6.node;
  if (this_00 !=
      (btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>> *)
      0x0) {
    iVar4 = bVar6.position;
    ptVar3 = btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
             ::GetField<2ul>(this_00);
    if (*key <= ptVar3[iVar4]) {
      bVar1 = false;
      goto LAB_0026cc5e;
    }
  }
  iVar7._12_4_ = 0;
  iVar7.node = (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                *)SUB128(SVar5.value._0_12_,0);
  iVar7.position = SUB124(SVar5.value._0_12_,8);
  iVar7 = internal_emplace<int_const&>(this,iVar7,args);
  this_00 = (btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
             *)iVar7.node;
  iVar4 = iVar7.position;
  bVar1 = true;
LAB_0026cc5e:
  (__return_storage_ptr__->first).node =
       (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
        *)this_00;
  (__return_storage_ptr__->first).position = iVar4;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::insert_unique(const key_type &key, Args &&... args)
        -> std::pair<iterator, bool> {
        if (empty()) {
            mutable_root() = rightmost_ = new_leaf_root_node(1);
        }

        auto res = internal_locate(key);
        iterator &iter = res.value;

        if (res.HasMatch()) {
            if (res.IsEq()) {
                // The key already exists in the tree, do nothing.
                return {iter, false};
            }
        } else {
            iterator last = internal_last(iter);
            if (last.node && !compare_keys(key, last.key())) {
                // The key already exists in the tree, do nothing.
                return {last, false};
            }
        }
        return {internal_emplace(iter, std::forward<Args>(args)...), true};
    }